

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O2

int32_t icu_63::PropNameData::findPropertyValueNameGroup(int32_t valueMapIndex,int32_t value)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  
  if (valueMapIndex != 0) {
    iVar1 = valueMapIndex + 2;
    iVar4 = *(int *)(valueMaps + (long)valueMapIndex * 4 + 4);
    if (iVar4 < 0x10) {
      for (; 0 < iVar4; iVar4 = iVar4 + -1) {
        iVar2 = *(int *)(valueMaps + (long)iVar1 * 4);
        if (value < iVar2) {
          return 0;
        }
        if (value < *(int *)(valueMaps + (long)iVar1 * 4 + 4)) {
          iVar2 = (iVar1 + 2 + value) - iVar2;
LAB_0030175d:
          return *(int32_t *)(valueMaps + (long)iVar2 * 4);
        }
        iVar1 = ((iVar1 + 2) - iVar2) + *(int *)(valueMaps + (long)iVar1 * 4 + 4);
      }
    }
    else {
      lVar6 = (long)iVar1;
      iVar2 = valueMapIndex + iVar4 + -0xe;
      lVar3 = (long)iVar2;
      piVar5 = (int *)(valueMaps + lVar6 * 4);
      do {
        iVar4 = *piVar5;
        if (iVar4 != value && value <= iVar4) {
          return 0;
        }
        if (iVar4 == value) goto LAB_0030175d;
        lVar6 = lVar6 + 1;
        iVar2 = iVar2 + 1;
        piVar5 = piVar5 + 1;
      } while (lVar6 < lVar3);
    }
  }
  return 0;
}

Assistant:

int32_t PropNameData::findPropertyValueNameGroup(int32_t valueMapIndex, int32_t value) {
    if(valueMapIndex==0) {
        return 0;  // The property does not have named values.
    }
    ++valueMapIndex;  // Skip the BytesTrie offset.
    int32_t numRanges=valueMaps[valueMapIndex++];
    if(numRanges<0x10) {
        // Ranges of values.
        for(; numRanges>0; --numRanges) {
            // Read and skip the start and limit of this range.
            int32_t start=valueMaps[valueMapIndex];
            int32_t limit=valueMaps[valueMapIndex+1];
            valueMapIndex+=2;
            if(value<start) {
                break;
            }
            if(value<limit) {
                return valueMaps[valueMapIndex+value-start];
            }
            valueMapIndex+=limit-start;  // Skip all entries for this range.
        }
    } else {
        // List of values.
        int32_t valuesStart=valueMapIndex;
        int32_t nameGroupOffsetsStart=valueMapIndex+numRanges-0x10;
        do {
            int32_t v=valueMaps[valueMapIndex];
            if(value<v) {
                break;
            }
            if(value==v) {
                return valueMaps[nameGroupOffsetsStart+valueMapIndex-valuesStart];
            }
        } while(++valueMapIndex<nameGroupOffsetsStart);
    }
    return 0;
}